

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::CallIndirectExpr::~CallIndirectExpr(CallIndirectExpr *this)

{
  CallIndirectExpr *this_local;
  
  ~CallIndirectExpr(this);
  operator_delete(this);
  return;
}

Assistant:

explicit CallIndirectExpr(const Location& loc = Location())
      : ExprMixin<ExprType::CallIndirect>(loc) {}